

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O3

void poly1305_blocks(poly1305_state_internal *st,uint8_t *m,size_t bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  uint uVar35;
  ulong uVar36;
  uint uVar38;
  ulong uVar39;
  undefined1 auVar37 [16];
  uint uVar40;
  uint uVar41;
  uint uVar44;
  xmmi alVar42;
  undefined1 auVar43 [16];
  uint64_t uVar45;
  undefined1 auVar46 [16];
  uint64_t uVar47;
  undefined1 auVar48 [16];
  ulong uVar49;
  uint64_t uVar50;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint64_t uVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  uint uVar62;
  xmmi alVar60;
  uint uVar63;
  ulong uVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar74;
  xmmi alVar72;
  undefined1 auVar73 [16];
  
  alVar60 = (st->field_1).H[0];
  uVar50 = (st->field_1).HH[2];
  uVar56 = (st->field_1).HH[3];
  alVar42 = (st->field_1).H[2];
  alVar72 = (st->field_1).H[3];
  uVar45 = (st->field_1).HH[8];
  uVar47 = (st->field_1).HH[9];
  if (0x3f < bytes) {
    uVar4 = st->P[0].R20.u[0];
    uVar5 = st->P[0].R20.u[1];
    uVar6 = st->P[0].R21.u[0];
    uVar7 = st->P[0].R21.u[1];
    uVar8 = st->P[0].R22.u[0];
    uVar9 = st->P[0].R22.u[1];
    uVar10 = st->P[0].R23.u[0];
    uVar11 = st->P[0].R23.u[1];
    uVar12 = st->P[0].R24.u[0];
    uVar13 = st->P[0].R24.u[1];
    uVar14 = st->P[0].S24.u[0];
    uVar15 = st->P[0].S24.u[1];
    uVar16 = st->P[0].S23.u[0];
    uVar17 = st->P[0].S23.u[1];
    uVar18 = st->P[0].S22.u[0];
    uVar19 = st->P[0].S22.u[1];
    uVar20 = st->P[1].R20.u[0];
    uVar21 = st->P[1].R20.u[1];
    uVar22 = st->P[1].R21.u[0];
    uVar23 = st->P[1].R21.u[1];
    uVar24 = st->P[1].S24.u[0];
    uVar25 = st->P[1].S24.u[1];
    uVar26 = st->P[1].S23.u[0];
    uVar27 = st->P[1].S23.u[1];
    uVar28 = st->P[1].S22.u[0];
    uVar29 = st->P[1].S22.u[1];
    alVar60 = (xmmi)((undefined1  [16])alVar60 & _DAT_00246c40);
    alVar42 = (xmmi)((undefined1  [16])alVar42 & _DAT_00246c40);
    alVar72 = (xmmi)((undefined1  [16])alVar72 & _DAT_00246c40);
    uVar30 = st->P[1].R22.u[0];
    uVar31 = st->P[1].R22.u[1];
    uVar32 = st->P[1].R23.u[0];
    uVar33 = st->P[1].R23.u[1];
    do {
      uVar57 = (uint)alVar60[0];
      uVar62 = (uint)alVar60[1];
      uVar67 = alVar60[0]._4_4_;
      uVar69 = alVar60[1]._4_4_;
      uVar40 = (uint)alVar42[0];
      uVar44 = (uint)alVar42[1];
      uVar58 = alVar42[0]._4_4_;
      uVar63 = alVar42[1]._4_4_;
      uVar71 = (uint)alVar72[0];
      uVar74 = (uint)alVar72[1];
      uVar35 = alVar72[0]._4_4_;
      uVar38 = alVar72[1]._4_4_;
      uVar1 = *(ulong *)((long)m + 0x10);
      uVar2 = *(ulong *)m;
      uVar3 = *(ulong *)((long)m + 8);
      uVar36 = uVar2 & 0x3ffffff;
      uVar39 = uVar1 & 0x3ffffff;
      uVar59 = uVar2 >> 0x1a & 0x3ffffff;
      uVar64 = uVar1 >> 0x1a & 0x3ffffff;
      uVar54 = *(ulong *)((long)m + 0x18) << 0xc;
      uVar68 = uVar3 << 0xc & 0x3ffffff | uVar2 >> 0x34;
      uVar70 = uVar54 & 0x3ffffff | uVar1 >> 0x34;
      uVar49 = (uVar3 << 0xc) >> 0x1a & 0x3ffffff;
      uVar55 = uVar54 >> 0x1a & 0x3ffffff;
      uVar54 = *(ulong *)((long)m + 0x18) >> 0x28;
      uVar41 = (uint)(uVar3 >> 0x28) | 0x1000000;
      uVar1 = *(ulong *)((long)m + 0x30);
      uVar2 = *(ulong *)((long)m + 0x20);
      auVar65._8_8_ = uVar1;
      auVar65._0_8_ = uVar2;
      auVar46._0_8_ =
           SUB168(auVar65 & _DAT_00246c20,0) + (st->P[1].S21.u[0] & 0xffffffff) * (ulong)uVar41 +
           (uVar28 & 0xffffffff) * uVar49 +
           (uVar26 & 0xffffffff) * uVar68 +
           (uVar24 & 0xffffffff) * uVar59 +
           (uVar20 & 0xffffffff) * uVar36 +
           (st->P[0].S21.u[0] & 0xffffffff) * (uVar45 & 0xffffffff) +
           ((uVar18 & 0xffffffff) * (ulong)uVar35 << 0x20) + (uVar18 & 0xffffffff) * (ulong)uVar71 +
           ((uVar16 & 0xffffffff) * (ulong)uVar58 << 0x20) + (uVar16 & 0xffffffff) * (ulong)uVar40 +
           (uVar14 & 0xffffffff) * (uVar50 & 0xffffffff) + (uVar4 & 0xffffffff) * (ulong)uVar57 +
           ((uVar4 & 0xffffffff) * (ulong)uVar67 << 0x20);
      auVar46._8_8_ =
           SUB168(auVar65 & _DAT_00246c20,8) +
           (st->P[1].S21.u[1] & 0xffffffff) * (uVar54 | 0x1000000) +
           (uVar29 & 0xffffffff) * uVar55 +
           (uVar27 & 0xffffffff) * uVar70 +
           (uVar25 & 0xffffffff) * uVar64 +
           (uVar21 & 0xffffffff) * uVar39 +
           (st->P[0].S21.u[1] & 0xffffffff) * (uVar47 & 0xffffffff) +
           ((uVar19 & 0xffffffff) * (ulong)uVar38 << 0x20) + (uVar19 & 0xffffffff) * (ulong)uVar74 +
           ((uVar17 & 0xffffffff) * (ulong)uVar63 << 0x20) + (uVar17 & 0xffffffff) * (ulong)uVar44 +
           (uVar15 & 0xffffffff) * (uVar56 & 0xffffffff) + (uVar5 & 0xffffffff) * (ulong)uVar62 +
           ((uVar5 & 0xffffffff) * (ulong)uVar69 << 0x20);
      auVar34._0_8_ = uVar2 >> 0x1a;
      auVar34._8_8_ = uVar1 >> 0x1a;
      auVar66._0_8_ = uVar2 >> 0x34;
      auVar66._8_8_ = uVar1 >> 0x34;
      auVar51._0_8_ = *(ulong *)((long)m + 0x28) << 0xc;
      auVar51._8_8_ = *(ulong *)((long)m + 0x38) << 0xc;
      auVar51 = auVar51 | auVar66;
      auVar52._0_8_ = auVar51._0_8_ >> 0x1a;
      auVar52._8_8_ = auVar51._8_8_ >> 0x1a;
      auVar53._0_8_ =
           SUB168(auVar52 & _DAT_00246c20,0) +
           (uVar24 & 0xffffffff) * (ulong)uVar41 + (uVar30 & 0xffffffff) * uVar59 +
           (uVar32 & 0xffffffff) * uVar36 +
           uVar49 * (uVar20 & 0xffffffff) +
           uVar68 * (uVar22 & 0xffffffff) +
           (uVar14 & 0xffffffff) * (uVar45 & 0xffffffff) +
           ((uVar4 & 0xffffffff) * (ulong)uVar35 << 0x20) + (uVar4 & 0xffffffff) * (ulong)uVar71 +
           ((uVar6 & 0xffffffff) * (ulong)uVar58 << 0x20) + (uVar6 & 0xffffffff) * (ulong)uVar40 +
           (uVar8 & 0xffffffff) * (uVar50 & 0xffffffff) +
           ((uVar10 & 0xffffffff) * (ulong)uVar67 << 0x20) + (uVar10 & 0xffffffff) * (ulong)uVar57;
      auVar53._8_8_ =
           SUB168(auVar52 & _DAT_00246c20,8) +
           (uVar25 & 0xffffffff) * (uVar54 | 0x1000000) + (uVar31 & 0xffffffff) * uVar64 +
           (uVar33 & 0xffffffff) * uVar39 +
           uVar55 * (uVar21 & 0xffffffff) +
           uVar70 * (uVar23 & 0xffffffff) +
           (uVar15 & 0xffffffff) * (uVar47 & 0xffffffff) +
           ((uVar5 & 0xffffffff) * (ulong)uVar38 << 0x20) + (uVar5 & 0xffffffff) * (ulong)uVar74 +
           ((uVar7 & 0xffffffff) * (ulong)uVar63 << 0x20) + (uVar7 & 0xffffffff) * (ulong)uVar44 +
           (uVar9 & 0xffffffff) * (uVar56 & 0xffffffff) +
           ((uVar11 & 0xffffffff) * (ulong)uVar69 << 0x20) + (uVar11 & 0xffffffff) * (ulong)uVar62;
      auVar48._0_8_ =
           (auVar46._0_8_ >> 0x1a) +
           SUB168(auVar34 & _DAT_00246c20,0) + (uVar28 & 0xffffffff) * (ulong)uVar41 +
           (uVar26 & 0xffffffff) * uVar49 +
           (uVar24 & 0xffffffff) * uVar68 +
           (uVar20 & 0xffffffff) * uVar59 +
           (uVar22 & 0xffffffff) * uVar36 +
           (uVar18 & 0xffffffff) * (uVar45 & 0xffffffff) +
           ((uVar16 & 0xffffffff) * (ulong)uVar35 << 0x20) + (uVar16 & 0xffffffff) * (ulong)uVar71 +
           ((uVar14 & 0xffffffff) * (ulong)uVar58 << 0x20) + (uVar14 & 0xffffffff) * (ulong)uVar40 +
           (uVar4 & 0xffffffff) * (uVar50 & 0xffffffff) + (uVar6 & 0xffffffff) * (ulong)uVar57 +
           ((uVar6 & 0xffffffff) * (ulong)uVar67 << 0x20);
      auVar48._8_8_ =
           (auVar46._8_8_ >> 0x1a) +
           SUB168(auVar34 & _DAT_00246c20,8) + (uVar29 & 0xffffffff) * (uVar54 | 0x1000000) +
           (uVar27 & 0xffffffff) * uVar55 +
           (uVar25 & 0xffffffff) * uVar70 +
           (uVar21 & 0xffffffff) * uVar64 +
           (uVar23 & 0xffffffff) * uVar39 +
           (uVar19 & 0xffffffff) * (uVar47 & 0xffffffff) +
           ((uVar17 & 0xffffffff) * (ulong)uVar38 << 0x20) + (uVar17 & 0xffffffff) * (ulong)uVar74 +
           ((uVar15 & 0xffffffff) * (ulong)uVar63 << 0x20) + (uVar15 & 0xffffffff) * (ulong)uVar44 +
           (uVar5 & 0xffffffff) * (uVar56 & 0xffffffff) + (uVar7 & 0xffffffff) * (ulong)uVar62 +
           ((uVar7 & 0xffffffff) * (ulong)uVar69 << 0x20);
      auVar37._0_8_ =
           (*(ulong *)((long)m + 0x28) >> 0x28) +
           uVar59 * (uVar32 & 0xffffffff) + uVar36 * (st->P[1].R24.u[0] & 0xffffffff) +
           (ulong)uVar41 * (uVar20 & 0xffffffff) +
           (uVar45 & 0xffffffff) * (uVar4 & 0xffffffff) + (ulong)uVar71 * (uVar6 & 0xffffffff) +
           ((ulong)uVar35 * (uVar6 & 0xffffffff) << 0x20) +
           ((ulong)uVar58 * (uVar8 & 0xffffffff) << 0x20) + (ulong)uVar40 * (uVar8 & 0xffffffff) +
           (uVar50 & 0xffffffff) * (uVar10 & 0xffffffff) +
           ((ulong)uVar67 * (uVar12 & 0xffffffff) << 0x20) + (ulong)uVar57 * (uVar12 & 0xffffffff) +
           uVar68 * (uVar30 & 0xffffffff) + uVar49 * (uVar22 & 0xffffffff) + 0x1000000 +
           (auVar53._0_8_ >> 0x1a);
      auVar37._8_8_ =
           (*(ulong *)((long)m + 0x38) >> 0x28) +
           uVar64 * (uVar33 & 0xffffffff) + uVar39 * (st->P[1].R24.u[1] & 0xffffffff) +
           (uVar54 | 0x1000000) * (uVar21 & 0xffffffff) +
           (uVar47 & 0xffffffff) * (uVar5 & 0xffffffff) +
           (alVar72[1] & 0xffffffff) * (uVar7 & 0xffffffff) +
           ((alVar72[1] >> 0x20) * (uVar7 & 0xffffffff) << 0x20) +
           ((alVar42[1] >> 0x20) * (uVar9 & 0xffffffff) << 0x20) +
           (alVar42[1] & 0xffffffff) * (uVar9 & 0xffffffff) +
           (uVar56 & 0xffffffff) * (uVar11 & 0xffffffff) +
           ((alVar60[1] >> 0x20) * (uVar13 & 0xffffffff) << 0x20) +
           (alVar60[1] & 0xffffffff) * (uVar13 & 0xffffffff) + uVar70 * (uVar31 & 0xffffffff) +
           uVar55 * (uVar23 & 0xffffffff) + 0x1000000 + (auVar53._8_8_ >> 0x1a);
      auVar43._0_8_ =
           (auVar48._0_8_ >> 0x1a) +
           SUB168(auVar51 & _DAT_00246c20,0) +
           (uVar26 & 0xffffffff) * (uVar3 >> 0x28 | 0x1000000) + (uVar30 & 0xffffffff) * uVar36 +
           uVar49 * (uVar24 & 0xffffffff) +
           uVar68 * (uVar20 & 0xffffffff) +
           (uVar22 & 0xffffffff) * uVar59 +
           (uVar16 & 0xffffffff) * (uVar45 & 0xffffffff) +
           ((uVar14 & 0xffffffff) * (ulong)uVar35 << 0x20) + (uVar14 & 0xffffffff) * (ulong)uVar71 +
           ((uVar4 & 0xffffffff) * (ulong)uVar58 << 0x20) +
           (uVar4 & 0xffffffff) * (ulong)uVar40 + (uVar6 & 0xffffffff) * (uVar50 & 0xffffffff) +
           ((uVar8 & 0xffffffff) * (ulong)uVar67 << 0x20) + (uVar8 & 0xffffffff) * (ulong)uVar57;
      auVar43._8_8_ =
           (auVar48._8_8_ >> 0x1a) +
           SUB168(auVar51 & _DAT_00246c20,8) +
           (uVar27 & 0xffffffff) * (uVar54 | 0x1000000) + (uVar31 & 0xffffffff) * uVar39 +
           uVar55 * (uVar25 & 0xffffffff) +
           uVar70 * (uVar21 & 0xffffffff) +
           (uVar23 & 0xffffffff) * uVar64 +
           (uVar17 & 0xffffffff) * (uVar47 & 0xffffffff) +
           ((uVar15 & 0xffffffff) * (ulong)uVar38 << 0x20) + (uVar15 & 0xffffffff) * (ulong)uVar74 +
           ((uVar5 & 0xffffffff) * (ulong)uVar63 << 0x20) +
           (uVar5 & 0xffffffff) * (ulong)uVar44 + (uVar7 & 0xffffffff) * (uVar56 & 0xffffffff) +
           ((uVar9 & 0xffffffff) * (ulong)uVar69 << 0x20) + (uVar9 & 0xffffffff) * (ulong)uVar62;
      auVar61._0_8_ = (auVar37._0_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar46 & _DAT_00246c20,0);
      auVar61._8_8_ = (auVar37._8_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar46 & _DAT_00246c20,8);
      auVar73._0_8_ = (auVar43._0_8_ >> 0x1a) + SUB168(auVar53 & _DAT_00246c20,0);
      auVar73._8_8_ = (auVar43._8_8_ >> 0x1a) + SUB168(auVar53 & _DAT_00246c20,8);
      uVar50 = (auVar61._0_8_ >> 0x1a) + SUB168(auVar48 & _DAT_00246c20,0);
      uVar56 = (auVar61._8_8_ >> 0x1a) + SUB168(auVar48 & _DAT_00246c20,8);
      uVar45 = (auVar73._0_8_ >> 0x1a) + SUB168(auVar37 & _DAT_00246c20,0);
      uVar47 = (auVar73._8_8_ >> 0x1a) + SUB168(auVar37 & _DAT_00246c20,8);
      alVar42 = (xmmi)(auVar43 & _DAT_00246c20);
      alVar60 = (xmmi)(auVar61 & _DAT_00246c20);
      alVar72 = (xmmi)(auVar73 & _DAT_00246c20);
      m = (uint8_t *)((long)m + 0x40);
      bytes = bytes - 0x40;
    } while (0x3f < bytes);
  }
  (st->field_1).H[0] = alVar60;
  (st->field_1).HH[2] = uVar50;
  (st->field_1).HH[3] = uVar56;
  (st->field_1).H[2] = alVar42;
  (st->field_1).H[3] = alVar72;
  (st->field_1).HH[8] = uVar45;
  (st->field_1).HH[9] = uVar47;
  return;
}

Assistant:

static void poly1305_blocks(poly1305_state_internal *st, const uint8_t *m,
                            size_t bytes) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);

  poly1305_power *p;
  xmmi H0, H1, H2, H3, H4;
  xmmi T0, T1, T2, T3, T4, T5, T6;
  xmmi M0, M1, M2, M3, M4;
  xmmi C1, C2;

  H0 = st->H[0];
  H1 = st->H[1];
  H2 = st->H[2];
  H3 = st->H[3];
  H4 = st->H[4];

  while (bytes >= 64) {
    // H *= [r^4,r^4]
    p = &st->P[0];
    T0 = _mm_mul_epu32(H0, p->R20.v);
    T1 = _mm_mul_epu32(H0, p->R21.v);
    T2 = _mm_mul_epu32(H0, p->R22.v);
    T3 = _mm_mul_epu32(H0, p->R23.v);
    T4 = _mm_mul_epu32(H0, p->R24.v);
    T5 = _mm_mul_epu32(H1, p->S24.v);
    T6 = _mm_mul_epu32(H1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H2, p->S23.v);
    T6 = _mm_mul_epu32(H2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H3, p->S22.v);
    T6 = _mm_mul_epu32(H3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H4, p->S21.v);
    T6 = _mm_mul_epu32(H4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H1, p->R21.v);
    T6 = _mm_mul_epu32(H1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H2, p->R20.v);
    T6 = _mm_mul_epu32(H2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H3, p->S24.v);
    T6 = _mm_mul_epu32(H3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H4, p->S23.v);
    T6 = _mm_mul_epu32(H4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]*[r^2,r^2]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                            _mm_loadl_epi64((const xmmi *)(m + 16)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                            _mm_loadl_epi64((const xmmi *)(m + 24)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    p = &st->P[1];
    T5 = _mm_mul_epu32(M0, p->R20.v);
    T6 = _mm_mul_epu32(M0, p->R21.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M1, p->S24.v);
    T6 = _mm_mul_epu32(M1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M2, p->S23.v);
    T6 = _mm_mul_epu32(M2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M3, p->S22.v);
    T6 = _mm_mul_epu32(M3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M4, p->S21.v);
    T6 = _mm_mul_epu32(M4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M0, p->R22.v);
    T6 = _mm_mul_epu32(M0, p->R23.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M1, p->R21.v);
    T6 = _mm_mul_epu32(M1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M2, p->R20.v);
    T6 = _mm_mul_epu32(M2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M3, p->S24.v);
    T6 = _mm_mul_epu32(M3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M4, p->S23.v);
    T6 = _mm_mul_epu32(M4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M0, p->R24.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 32)),
                            _mm_loadl_epi64((const xmmi *)(m + 48)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 40)),
                            _mm_loadl_epi64((const xmmi *)(m + 56)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    T0 = _mm_add_epi64(T0, M0);
    T1 = _mm_add_epi64(T1, M1);
    T2 = _mm_add_epi64(T2, M2);
    T3 = _mm_add_epi64(T3, M3);
    T4 = _mm_add_epi64(T4, M4);

    // reduce
    C1 = _mm_srli_epi64(T0, 26);
    C2 = _mm_srli_epi64(T3, 26);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_and_si128(T3, MMASK);
    T1 = _mm_add_epi64(T1, C1);
    T4 = _mm_add_epi64(T4, C2);
    C1 = _mm_srli_epi64(T1, 26);
    C2 = _mm_srli_epi64(T4, 26);
    T1 = _mm_and_si128(T1, MMASK);
    T4 = _mm_and_si128(T4, MMASK);
    T2 = _mm_add_epi64(T2, C1);
    T0 = _mm_add_epi64(T0, _mm_mul_epu32(C2, FIVE));
    C1 = _mm_srli_epi64(T2, 26);
    C2 = _mm_srli_epi64(T0, 26);
    T2 = _mm_and_si128(T2, MMASK);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_add_epi64(T3, C1);
    T1 = _mm_add_epi64(T1, C2);
    C1 = _mm_srli_epi64(T3, 26);
    T3 = _mm_and_si128(T3, MMASK);
    T4 = _mm_add_epi64(T4, C1);

    // H = (H*[r^4,r^4] + [Mx,My]*[r^2,r^2] + [Mx,My])
    H0 = T0;
    H1 = T1;
    H2 = T2;
    H3 = T3;
    H4 = T4;

    m += 64;
    bytes -= 64;
  }

  st->H[0] = H0;
  st->H[1] = H1;
  st->H[2] = H2;
  st->H[3] = H3;
  st->H[4] = H4;
}